

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O1

ssize_t peek_at_header(archive_read_filter *filter,int *pbits)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  long in_RAX;
  short *psVar4;
  void *pvVar5;
  size_t min;
  size_t sVar6;
  ssize_t avail;
  long local_38;
  
  local_38 = in_RAX;
  psVar4 = (short *)__archive_read_filter_ahead(filter,10,&local_38);
  if (psVar4 == (short *)0x0) {
    return 0;
  }
  if (local_38 == 0) {
    return 0;
  }
  if (((char)psVar4[1] == '\b' && *psVar4 == -0x74e1) &&
     (bVar2 = *(byte *)((long)psVar4 + 3), bVar2 < 0x20)) {
    min = 10;
    if ((bVar2 & 4) != 0) {
      psVar4 = (short *)__archive_read_filter_ahead(filter,0xc,&local_38);
      if (psVar4 == (short *)0x0) goto LAB_003f3e21;
      min = (ulong)(ushort)psVar4[5] + 0xc;
    }
    bVar3 = bVar2 & 8;
    while (bVar3 != 0) {
      if (local_38 <= (long)min) {
        psVar4 = (short *)__archive_read_filter_ahead(filter,min + 1,&local_38);
      }
      if (psVar4 == (short *)0x0) {
        return 0;
      }
      bVar3 = *(byte *)((long)psVar4 + min);
      min = min + 1;
    }
    sVar6 = min;
    if (0xf < bVar2) {
      do {
        min = sVar6 + 1;
        if (local_38 <= (long)sVar6) {
          psVar4 = (short *)__archive_read_filter_ahead(filter,min,&local_38);
        }
        if (psVar4 == (short *)0x0) goto LAB_003f3e21;
        pcVar1 = (char *)((long)psVar4 + sVar6);
        sVar6 = min;
      } while (*pcVar1 != '\0');
    }
    if ((bVar2 & 2) != 0) {
      min = min + 2;
      pvVar5 = __archive_read_filter_ahead(filter,min,&local_38);
      if (pvVar5 == (void *)0x0) goto LAB_003f3e21;
    }
    if (pbits != (int *)0x0) {
      *pbits = 0x1b;
    }
  }
  else {
LAB_003f3e21:
    min = 0;
  }
  return min;
}

Assistant:

static ssize_t
peek_at_header(struct archive_read_filter *filter, int *pbits)
{
	const unsigned char *p;
	ssize_t avail, len;
	int bits = 0;
	int header_flags;

	/* Start by looking at the first ten bytes of the header, which
	 * is all fixed layout. */
	len = 10;
	p = __archive_read_filter_ahead(filter, len, &avail);
	if (p == NULL || avail == 0)
		return (0);
	/* We only support deflation- third byte must be 0x08. */
	if (memcmp(p, "\x1F\x8B\x08", 3) != 0)
		return (0);
	bits += 24;
	if ((p[3] & 0xE0)!= 0)	/* No reserved flags set. */
		return (0);
	bits += 3;
	header_flags = p[3];
	/* Bytes 4-7 are mod time. */
	/* Byte 8 is deflate flags. */
	/* XXXX TODO: return deflate flags back to consume_header for use
	   in initializing the decompressor. */
	/* Byte 9 is OS. */

	/* Optional extra data:  2 byte length plus variable body. */
	if (header_flags & 4) {
		p = __archive_read_filter_ahead(filter, len + 2, &avail);
		if (p == NULL)
			return (0);
		len += ((int)p[len + 1] << 8) | (int)p[len];
		len += 2;
	}

	/* Null-terminated optional filename. */
	if (header_flags & 8) {
		do {
			++len;
			if (avail < len)
				p = __archive_read_filter_ahead(filter,
				    len, &avail);
			if (p == NULL)
				return (0);
		} while (p[len - 1] != 0);
	}

	/* Null-terminated optional comment. */
	if (header_flags & 16) {
		do {
			++len;
			if (avail < len)
				p = __archive_read_filter_ahead(filter,
				    len, &avail);
			if (p == NULL)
				return (0);
		} while (p[len - 1] != 0);
	}

	/* Optional header CRC */
	if ((header_flags & 2)) {
		p = __archive_read_filter_ahead(filter, len + 2, &avail);
		if (p == NULL)
			return (0);
#if 0
	int hcrc = ((int)p[len + 1] << 8) | (int)p[len];
	int crc = /* XXX TODO: Compute header CRC. */;
	if (crc != hcrc)
		return (0);
	bits += 16;
#endif
		len += 2;
	}

	if (pbits != NULL)
		*pbits = bits;
	return (len);
}